

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int posixUnlock(sqlite3_file *id,int eFileLock,int handleNFSUnlock)

{
  int iVar1;
  int *piVar2;
  int local_54;
  undefined1 local_50 [4];
  int rc;
  flock lock;
  unixInodeInfo *pInode;
  unixFile *pFile;
  int handleNFSUnlock_local;
  int eFileLock_local;
  sqlite3_file *id_local;
  
  local_54 = 0;
  if ((int)(uint)*(byte *)((long)&id[3].pMethods + 4) <= eFileLock) {
    return 0;
  }
  unixEnterMutex();
  lock._24_8_ = id[2].pMethods;
  if (1 < *(byte *)((long)&id[3].pMethods + 4)) {
    if (eFileLock == 1) {
      local_50._0_2_ = 0;
      local_50._2_2_ = 0;
      lock._0_8_ = SEXT48(sqlite3PendingByte + 2);
      lock.l_start = 0x1fe;
      iVar1 = unixFileLock((unixFile *)id,(flock *)local_50);
      if (iVar1 != 0) {
        local_54 = 0x90a;
        piVar2 = __errno_location();
        storeLastErrno((unixFile *)id,*piVar2);
        goto LAB_003edb7c;
      }
    }
    local_50._0_2_ = 2;
    local_50._2_2_ = 0;
    lock._0_8_ = SEXT48(sqlite3PendingByte);
    lock.l_start = 2;
    iVar1 = unixFileLock((unixFile *)id,(flock *)local_50);
    if (iVar1 != 0) {
      local_54 = 0x80a;
      piVar2 = __errno_location();
      storeLastErrno((unixFile *)id,*piVar2);
      goto LAB_003edb7c;
    }
    *(undefined1 *)(lock._24_8_ + 0x14) = 1;
  }
  if (eFileLock == 0) {
    *(int *)(lock._24_8_ + 0x10) = *(int *)(lock._24_8_ + 0x10) + -1;
    if (*(int *)(lock._24_8_ + 0x10) == 0) {
      local_50._0_2_ = 2;
      local_50._2_2_ = 0;
      lock.l_start = 0;
      lock.l_type = 0;
      lock.l_whence = 0;
      lock._4_4_ = 0;
      iVar1 = unixFileLock((unixFile *)id,(flock *)local_50);
      if (iVar1 == 0) {
        *(undefined1 *)(lock._24_8_ + 0x14) = 0;
      }
      else {
        local_54 = 0x80a;
        piVar2 = __errno_location();
        storeLastErrno((unixFile *)id,*piVar2);
        *(undefined1 *)(lock._24_8_ + 0x14) = 0;
        *(undefined1 *)((long)&id[3].pMethods + 4) = 0;
      }
    }
    *(int *)(lock._24_8_ + 0x28) = *(int *)(lock._24_8_ + 0x28) + -1;
    if (*(int *)(lock._24_8_ + 0x28) == 0) {
      closePendingFds((unixFile *)id);
    }
  }
LAB_003edb7c:
  unixLeaveMutex();
  if (local_54 == 0) {
    *(char *)((long)&id[3].pMethods + 4) = (char)eFileLock;
  }
  return local_54;
}

Assistant:

static int posixUnlock(sqlite3_file *id, int eFileLock, int handleNFSUnlock){
  unixFile *pFile = (unixFile*)id;
  unixInodeInfo *pInode;
  struct flock lock;
  int rc = SQLITE_OK;

  assert( pFile );
  OSTRACE(("UNLOCK  %d %d was %d(%d,%d) pid=%d (unix)\n", pFile->h, eFileLock,
      pFile->eFileLock, pFile->pInode->eFileLock, pFile->pInode->nShared,
      osGetpid(0)));

  assert( eFileLock<=SHARED_LOCK );
  if( pFile->eFileLock<=eFileLock ){
    return SQLITE_OK;
  }
  unixEnterMutex();
  pInode = pFile->pInode;
  assert( pInode->nShared!=0 );
  if( pFile->eFileLock>SHARED_LOCK ){
    assert( pInode->eFileLock==pFile->eFileLock );

#ifdef SQLITE_DEBUG
    /* When reducing a lock such that other processes can start
    ** reading the database file again, make sure that the
    ** transaction counter was updated if any part of the database
    ** file changed.  If the transaction counter is not updated,
    ** other connections to the same file might not realize that
    ** the file has changed and hence might not know to flush their
    ** cache.  The use of a stale cache can lead to database corruption.
    */
    pFile->inNormalWrite = 0;
#endif

    /* downgrading to a shared lock on NFS involves clearing the write lock
    ** before establishing the readlock - to avoid a race condition we downgrade
    ** the lock in 2 blocks, so that part of the range will be covered by a 
    ** write lock until the rest is covered by a read lock:
    **  1:   [WWWWW]
    **  2:   [....W]
    **  3:   [RRRRW]
    **  4:   [RRRR.]
    */
    if( eFileLock==SHARED_LOCK ){
#if !defined(__APPLE__) || !SQLITE_ENABLE_LOCKING_STYLE
      (void)handleNFSUnlock;
      assert( handleNFSUnlock==0 );
#endif
#if defined(__APPLE__) && SQLITE_ENABLE_LOCKING_STYLE
      if( handleNFSUnlock ){
        int tErrno;               /* Error code from system call errors */
        off_t divSize = SHARED_SIZE - 1;
        
        lock.l_type = F_UNLCK;
        lock.l_whence = SEEK_SET;
        lock.l_start = SHARED_FIRST;
        lock.l_len = divSize;
        if( unixFileLock(pFile, &lock)==(-1) ){
          tErrno = errno;
          rc = SQLITE_IOERR_UNLOCK;
          storeLastErrno(pFile, tErrno);
          goto end_unlock;
        }
        lock.l_type = F_RDLCK;
        lock.l_whence = SEEK_SET;
        lock.l_start = SHARED_FIRST;
        lock.l_len = divSize;
        if( unixFileLock(pFile, &lock)==(-1) ){
          tErrno = errno;
          rc = sqliteErrorFromPosixError(tErrno, SQLITE_IOERR_RDLOCK);
          if( IS_LOCK_ERROR(rc) ){
            storeLastErrno(pFile, tErrno);
          }
          goto end_unlock;
        }
        lock.l_type = F_UNLCK;
        lock.l_whence = SEEK_SET;
        lock.l_start = SHARED_FIRST+divSize;
        lock.l_len = SHARED_SIZE-divSize;
        if( unixFileLock(pFile, &lock)==(-1) ){
          tErrno = errno;
          rc = SQLITE_IOERR_UNLOCK;
          storeLastErrno(pFile, tErrno);
          goto end_unlock;
        }
      }else
#endif /* defined(__APPLE__) && SQLITE_ENABLE_LOCKING_STYLE */
      {
        lock.l_type = F_RDLCK;
        lock.l_whence = SEEK_SET;
        lock.l_start = SHARED_FIRST;
        lock.l_len = SHARED_SIZE;
        if( unixFileLock(pFile, &lock) ){
          /* In theory, the call to unixFileLock() cannot fail because another
          ** process is holding an incompatible lock. If it does, this 
          ** indicates that the other process is not following the locking
          ** protocol. If this happens, return SQLITE_IOERR_RDLOCK. Returning
          ** SQLITE_BUSY would confuse the upper layer (in practice it causes 
          ** an assert to fail). */ 
          rc = SQLITE_IOERR_RDLOCK;
          storeLastErrno(pFile, errno);
          goto end_unlock;
        }
      }
    }
    lock.l_type = F_UNLCK;
    lock.l_whence = SEEK_SET;
    lock.l_start = PENDING_BYTE;
    lock.l_len = 2L;  assert( PENDING_BYTE+1==RESERVED_BYTE );
    if( unixFileLock(pFile, &lock)==0 ){
      pInode->eFileLock = SHARED_LOCK;
    }else{
      rc = SQLITE_IOERR_UNLOCK;
      storeLastErrno(pFile, errno);
      goto end_unlock;
    }
  }
  if( eFileLock==NO_LOCK ){
    /* Decrement the shared lock counter.  Release the lock using an
    ** OS call only when all threads in this same process have released
    ** the lock.
    */
    pInode->nShared--;
    if( pInode->nShared==0 ){
      lock.l_type = F_UNLCK;
      lock.l_whence = SEEK_SET;
      lock.l_start = lock.l_len = 0L;
      if( unixFileLock(pFile, &lock)==0 ){
        pInode->eFileLock = NO_LOCK;
      }else{
        rc = SQLITE_IOERR_UNLOCK;
        storeLastErrno(pFile, errno);
        pInode->eFileLock = NO_LOCK;
        pFile->eFileLock = NO_LOCK;
      }
    }

    /* Decrement the count of locks against this same file.  When the
    ** count reaches zero, close any other file descriptors whose close
    ** was deferred because of outstanding locks.
    */
    pInode->nLock--;
    assert( pInode->nLock>=0 );
    if( pInode->nLock==0 ){
      closePendingFds(pFile);
    }
  }

end_unlock:
  unixLeaveMutex();
  if( rc==SQLITE_OK ) pFile->eFileLock = eFileLock;
  return rc;
}